

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_attribute __thiscall pugi::xml_node::prepend_copy(xml_node *this,xml_attribute *proto)

{
  xml_node_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  xml_attribute_struct *pxVar3;
  xml_attribute_struct *da;
  uint uVar4;
  
  if ((((proto->_attr == (xml_attribute_struct *)0x0) ||
       (pxVar1 = this->_root, pxVar1 == (xml_node_struct *)0x0)) ||
      ((uVar4 = (uint)pxVar1->header & 0xf, uVar4 != 7 && (uVar4 != 2)))) ||
     (da = impl::anon_unknown_0::allocate_attribute
                     (*(xml_allocator **)((long)pxVar1 - (pxVar1->header >> 8))),
     da == (xml_attribute_struct *)0x0)) {
    da = (xml_attribute_struct *)0x0;
  }
  else {
    pxVar1 = this->_root;
    pxVar2 = pxVar1->first_attribute;
    pxVar3 = da;
    if (pxVar2 != (xml_attribute_struct *)0x0) {
      da->prev_attribute_c = pxVar2->prev_attribute_c;
      pxVar3 = pxVar2;
    }
    pxVar3->prev_attribute_c = da;
    da->next_attribute = pxVar2;
    pxVar1->first_attribute = da;
    impl::anon_unknown_0::node_copy_attribute(da,proto->_attr);
  }
  return (xml_attribute)da;
}

Assistant:

PUGI_IMPL_FN bool xml_attribute::operator!() const
	{
		return !_attr;
	}